

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlsave.c
# Opt level: O2

void xmlNodeDumpOutput(xmlOutputBufferPtr buf,xmlDocPtr doc,xmlNodePtr cur,int level,int format,
                      char *encoding)

{
  uint uVar1;
  int iVar2;
  xmlDtdPtr pxVar3;
  uint uVar4;
  xmlSaveCtxt local_a8;
  
  xmlInitParser();
  if (cur != (xmlNodePtr)0x0 && buf != (xmlOutputBufferPtr)0x0) {
    uVar1 = 100;
    if ((uint)level < 100) {
      uVar1 = level;
    }
    uVar4 = 0;
    if (-1 < level) {
      uVar4 = uVar1;
    }
    local_a8.encoding = "UTF-8";
    if (encoding != (char *)0x0) {
      local_a8.encoding = (xmlChar *)encoding;
    }
    local_a8.handler = (xmlCharEncodingHandlerPtr)0x0;
    local_a8.format = 0;
    local_a8.indent[0] = '\0';
    local_a8.indent[1] = '\0';
    local_a8.indent[2] = '\0';
    local_a8.indent[3] = '\0';
    local_a8.indent_size = 0;
    local_a8._108_4_ = 0;
    local_a8.escape = (xmlCharEncodingOutputFunc)0x0;
    local_a8.indent[0x34] = '\0';
    local_a8.indent[0x35] = '\0';
    local_a8.indent[0x36] = '\0';
    local_a8.indent[0x37] = '\0';
    local_a8.indent[0x38] = '\0';
    local_a8.indent[0x39] = '\0';
    local_a8.indent[0x3a] = '\0';
    local_a8.indent[0x3b] = '\0';
    local_a8.indent[0x3c] = '\0';
    local_a8._97_3_ = 0;
    local_a8.indent_nr = 0;
    local_a8.indent[0x24] = '\0';
    local_a8.indent[0x25] = '\0';
    local_a8.indent[0x26] = '\0';
    local_a8.indent[0x27] = '\0';
    local_a8.indent[0x28] = '\0';
    local_a8.indent[0x29] = '\0';
    local_a8.indent[0x2a] = '\0';
    local_a8.indent[0x2b] = '\0';
    local_a8.indent[0x2c] = '\0';
    local_a8.indent[0x2d] = '\0';
    local_a8.indent[0x2e] = '\0';
    local_a8.indent[0x2f] = '\0';
    local_a8.indent[0x30] = '\0';
    local_a8.indent[0x31] = '\0';
    local_a8.indent[0x32] = '\0';
    local_a8.indent[0x33] = '\0';
    local_a8.indent[0x14] = '\0';
    local_a8.indent[0x15] = '\0';
    local_a8.indent[0x16] = '\0';
    local_a8.indent[0x17] = '\0';
    local_a8.indent[0x18] = '\0';
    local_a8.indent[0x19] = '\0';
    local_a8.indent[0x1a] = '\0';
    local_a8.indent[0x1b] = '\0';
    local_a8.indent[0x1c] = '\0';
    local_a8.indent[0x1d] = '\0';
    local_a8.indent[0x1e] = '\0';
    local_a8.indent[0x1f] = '\0';
    local_a8.indent[0x20] = '\0';
    local_a8.indent[0x21] = '\0';
    local_a8.indent[0x22] = '\0';
    local_a8.indent[0x23] = '\0';
    local_a8.indent[4] = '\0';
    local_a8.indent[5] = '\0';
    local_a8.indent[6] = '\0';
    local_a8.indent[7] = '\0';
    local_a8.indent[8] = '\0';
    local_a8.indent[9] = '\0';
    local_a8.indent[10] = '\0';
    local_a8.indent[0xb] = '\0';
    local_a8.indent[0xc] = '\0';
    local_a8.indent[0xd] = '\0';
    local_a8.indent[0xe] = '\0';
    local_a8.indent[0xf] = '\0';
    local_a8.indent[0x10] = '\0';
    local_a8.indent[0x11] = '\0';
    local_a8.indent[0x12] = '\0';
    local_a8.indent[0x13] = '\0';
    local_a8._24_8_ = (ulong)uVar4 << 0x20;
    local_a8.buf = buf;
    xmlSaveCtxtInit(&local_a8,0x21 - (uint)(format == 0));
    pxVar3 = xmlGetIntSubset(doc);
    if ((pxVar3 != (xmlDtdPtr)0x0) &&
       (iVar2 = xmlIsXHTML(pxVar3->SystemID,pxVar3->ExternalID), 0 < iVar2)) {
      xhtmlNodeDumpOutput(&local_a8,cur);
      return;
    }
    xmlNodeDumpOutputInternal(&local_a8,cur);
  }
  return;
}

Assistant:

void
xmlNodeDumpOutput(xmlOutputBufferPtr buf, xmlDocPtr doc, xmlNodePtr cur,
                  int level, int format, const char *encoding)
{
    xmlSaveCtxt ctxt;
    int options;
#ifdef LIBXML_HTML_ENABLED
    xmlDtdPtr dtd;
    int is_xhtml = 0;
#endif

    (void) doc;

    xmlInitParser();

    if ((buf == NULL) || (cur == NULL)) return;

    if (level < 0)
        level = 0;
    else if (level > 100)
        level = 100;

    if (encoding == NULL)
        encoding = "UTF-8";

    memset(&ctxt, 0, sizeof(ctxt));
    ctxt.buf = buf;
    ctxt.level = level;
    ctxt.encoding = (const xmlChar *) encoding;

    options = XML_SAVE_AS_XML;
    if (format)
        options |= XML_SAVE_FORMAT;
    xmlSaveCtxtInit(&ctxt, options);

#ifdef LIBXML_HTML_ENABLED
    dtd = xmlGetIntSubset(doc);
    if (dtd != NULL) {
	is_xhtml = xmlIsXHTML(dtd->SystemID, dtd->ExternalID);
	if (is_xhtml < 0)
	    is_xhtml = 0;
    }

    if (is_xhtml)
        xhtmlNodeDumpOutput(&ctxt, cur);
    else
#endif
        xmlNodeDumpOutputInternal(&ctxt, cur);
}